

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apted_tree_index_impl.h
# Opt level: O0

void __thiscall
ted::APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>::
treeEditDist(APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
             *this,TreeIndexAPTED *t1,TreeIndexAPTED *t2,int it1subtree,int it2subtree,
            Matrix<double> *forestdist,bool treesSwapped)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  UnitCostModelLD<label::StringLabel> *pUVar5;
  int iVar6;
  int iVar7;
  const_reference pvVar8;
  double *pdVar9;
  double dVar10;
  float local_1ac;
  float local_1a8;
  float local_1a4;
  double local_180;
  double local_118;
  double local_f8;
  double local_c8;
  double local_a8;
  double local_80;
  double u;
  int j1_1;
  int i1_1;
  int j1;
  int i1;
  float dc;
  float db;
  float da;
  int joff;
  int ioff;
  int j;
  int i;
  bool treesSwapped_local;
  Matrix<double> *forestdist_local;
  int it2subtree_local;
  int it1subtree_local;
  TreeIndexAPTED *t2_local;
  TreeIndexAPTED *t1_local;
  APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED> *this_local;
  
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(t1->super_PreLToPostL).prel_to_postl_,(long)it1subtree);
  iVar2 = *pvVar8;
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(t2->super_PreLToPostL).prel_to_postl_,(long)it2subtree);
  iVar3 = *pvVar8;
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(t1->super_PostLToLLD).postl_to_lld_,(long)iVar2);
  iVar6 = *pvVar8 + -1;
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(t2->super_PostLToLLD).postl_to_lld_,(long)iVar3);
  iVar7 = *pvVar8 + -1;
  pdVar9 = data_structures::Matrix<double>::at(forestdist,0,0);
  *pdVar9 = 0.0;
  for (i1_1 = 1; i1_1 <= iVar2 - iVar6; i1_1 = i1_1 + 1) {
    pdVar9 = data_structures::Matrix<double>::read_at(forestdist,(long)(i1_1 + -1),0);
    dVar10 = *pdVar9;
    if (treesSwapped) {
      pUVar5 = (this->
               super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
               ).c_;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(t1->super_PostLToLabelId).postl_to_label_id_,(long)(i1_1 + iVar6));
      local_80 = cost_model::UnitCostModelLD<label::StringLabel>::ins(pUVar5,*pvVar8);
    }
    else {
      pUVar5 = (this->
               super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
               ).c_;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(t1->super_PostLToLabelId).postl_to_label_id_,(long)(i1_1 + iVar6));
      local_80 = cost_model::UnitCostModelLD<label::StringLabel>::del(pUVar5,*pvVar8);
    }
    pdVar9 = data_structures::Matrix<double>::at(forestdist,(long)i1_1,0);
    *pdVar9 = dVar10 + local_80;
  }
  for (j1_1 = 1; j1_1 <= iVar3 - iVar7; j1_1 = j1_1 + 1) {
    pdVar9 = data_structures::Matrix<double>::read_at(forestdist,0,(long)(j1_1 + -1));
    dVar10 = *pdVar9;
    if (treesSwapped) {
      pUVar5 = (this->
               super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
               ).c_;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(t2->super_PostLToLabelId).postl_to_label_id_,(long)(j1_1 + iVar7));
      local_a8 = cost_model::UnitCostModelLD<label::StringLabel>::del(pUVar5,*pvVar8);
    }
    else {
      pUVar5 = (this->
               super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
               ).c_;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(t2->super_PostLToLabelId).postl_to_label_id_,(long)(j1_1 + iVar7));
      local_a8 = cost_model::UnitCostModelLD<label::StringLabel>::ins(pUVar5,*pvVar8);
    }
    pdVar9 = data_structures::Matrix<double>::at(forestdist,0,(long)j1_1);
    *pdVar9 = dVar10 + local_a8;
  }
  u._4_4_ = 1;
  do {
    if (iVar2 - iVar6 < u._4_4_) {
      return;
    }
    for (u._0_4_ = 1; u._0_4_ <= iVar3 - iVar7; u._0_4_ = u._0_4_ + 1) {
      (this->
      super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>).
      subproblem_counter_ =
           (this->
           super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
           ).subproblem_counter_ + 1;
      if (treesSwapped) {
        pUVar5 = (this->
                 super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                 ).c_;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(t2->super_PostLToLabelId).postl_to_label_id_,(long)(u._0_4_ + iVar7));
        iVar4 = *pvVar8;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(t1->super_PostLToLabelId).postl_to_label_id_,(long)(u._4_4_ + iVar6));
        local_c8 = cost_model::UnitCostModelLD<label::StringLabel>::ren(pUVar5,iVar4,*pvVar8);
      }
      else {
        pUVar5 = (this->
                 super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                 ).c_;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(t1->super_PostLToLabelId).postl_to_label_id_,(long)(u._4_4_ + iVar6));
        iVar4 = *pvVar8;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(t2->super_PostLToLabelId).postl_to_label_id_,(long)(u._0_4_ + iVar7));
        local_c8 = cost_model::UnitCostModelLD<label::StringLabel>::ren(pUVar5,iVar4,*pvVar8);
      }
      pdVar9 = data_structures::Matrix<double>::read_at
                         (forestdist,(long)(u._4_4_ + -1),(long)u._0_4_);
      dVar10 = *pdVar9;
      if (treesSwapped) {
        pUVar5 = (this->
                 super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                 ).c_;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(t1->super_PostLToLabelId).postl_to_label_id_,(long)(u._4_4_ + iVar6));
        local_f8 = cost_model::UnitCostModelLD<label::StringLabel>::ins(pUVar5,*pvVar8);
      }
      else {
        pUVar5 = (this->
                 super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                 ).c_;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(t1->super_PostLToLabelId).postl_to_label_id_,(long)(u._4_4_ + iVar6));
        local_f8 = cost_model::UnitCostModelLD<label::StringLabel>::del(pUVar5,*pvVar8);
      }
      local_1ac = (float)(dVar10 + local_f8);
      pdVar9 = data_structures::Matrix<double>::read_at
                         (forestdist,(long)u._4_4_,(long)(u._0_4_ + -1));
      dVar10 = *pdVar9;
      if (treesSwapped) {
        pUVar5 = (this->
                 super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                 ).c_;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(t2->super_PostLToLabelId).postl_to_label_id_,(long)(u._0_4_ + iVar7));
        local_118 = cost_model::UnitCostModelLD<label::StringLabel>::del(pUVar5,*pvVar8);
      }
      else {
        pUVar5 = (this->
                 super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                 ).c_;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(t2->super_PostLToLabelId).postl_to_label_id_,(long)(u._0_4_ + iVar7));
        local_118 = cost_model::UnitCostModelLD<label::StringLabel>::ins(pUVar5,*pvVar8);
      }
      local_1a4 = (float)(dVar10 + local_118);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(t1->super_PostLToLLD).postl_to_lld_,(long)(u._4_4_ + iVar6));
      iVar4 = *pvVar8;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(t1->super_PostLToLLD).postl_to_lld_,(long)iVar2);
      if (iVar4 == *pvVar8) {
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(t2->super_PostLToLLD).postl_to_lld_,(long)(u._0_4_ + iVar7));
        iVar4 = *pvVar8;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(t2->super_PostLToLLD).postl_to_lld_,(long)iVar3);
        if (iVar4 != *pvVar8) goto LAB_0011dfac;
        pdVar9 = data_structures::Matrix<double>::read_at
                           (forestdist,(long)(u._4_4_ + -1),(long)(u._0_4_ + -1));
        dVar10 = *pdVar9;
        if (treesSwapped) {
          pdVar9 = data_structures::Matrix<double>::read_at
                             (forestdist,(long)(u._4_4_ + -1),(long)(u._0_4_ + -1));
          dVar1 = *pdVar9;
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(t2->super_PostLToPreL).postl_to_prel_,(long)(u._0_4_ + iVar7));
          iVar4 = *pvVar8;
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(t1->super_PostLToPreL).postl_to_prel_,(long)(u._4_4_ + iVar6));
          pdVar9 = data_structures::Matrix<double>::at(&this->delta_,(long)iVar4,(long)*pvVar8);
          *pdVar9 = dVar1;
        }
        else {
          pdVar9 = data_structures::Matrix<double>::read_at
                             (forestdist,(long)(u._4_4_ + -1),(long)(u._0_4_ + -1));
          dVar1 = *pdVar9;
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(t1->super_PostLToPreL).postl_to_prel_,(long)(u._4_4_ + iVar6));
          iVar4 = *pvVar8;
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(t2->super_PostLToPreL).postl_to_prel_,(long)(u._0_4_ + iVar7));
          pdVar9 = data_structures::Matrix<double>::at(&this->delta_,(long)iVar4,(long)*pvVar8);
          *pdVar9 = dVar1;
        }
      }
      else {
LAB_0011dfac:
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(t1->super_PostLToLLD).postl_to_lld_,(long)(u._4_4_ + iVar6));
        iVar4 = *pvVar8;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(t2->super_PostLToLLD).postl_to_lld_,(long)(u._0_4_ + iVar7));
        pdVar9 = data_structures::Matrix<double>::read_at
                           (forestdist,(long)((iVar4 + -1) - iVar6),(long)((*pvVar8 + -1) - iVar7));
        dVar10 = *pdVar9;
        if (treesSwapped) {
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(t2->super_PostLToPreL).postl_to_prel_,(long)(u._0_4_ + iVar7));
          iVar4 = *pvVar8;
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(t1->super_PostLToPreL).postl_to_prel_,(long)(u._4_4_ + iVar6));
          pdVar9 = data_structures::Matrix<double>::read_at(&this->delta_,(long)iVar4,(long)*pvVar8)
          ;
          local_180 = *pdVar9;
        }
        else {
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(t1->super_PostLToPreL).postl_to_prel_,(long)(u._4_4_ + iVar6));
          iVar4 = *pvVar8;
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(t2->super_PostLToPreL).postl_to_prel_,(long)(u._0_4_ + iVar7));
          pdVar9 = data_structures::Matrix<double>::read_at(&this->delta_,(long)iVar4,(long)*pvVar8)
          ;
          local_180 = *pdVar9;
        }
        dVar10 = dVar10 + local_180;
      }
      j1 = (int)(float)(dVar10 + local_c8);
      if (local_1ac < local_1a4) {
        if ((float)j1 <= local_1ac) {
          local_1ac = (float)j1;
        }
        local_1a8 = local_1ac;
      }
      else {
        if ((float)j1 <= local_1a4) {
          local_1a4 = (float)j1;
        }
        local_1a8 = local_1a4;
      }
      pdVar9 = data_structures::Matrix<double>::at(forestdist,(long)u._4_4_,(long)u._0_4_);
      *pdVar9 = (double)local_1a8;
    }
    u._4_4_ = u._4_4_ + 1;
  } while( true );
}

Assistant:

void APTEDTreeIndex<CostModel, TreeIndex>::treeEditDist(const TreeIndex& t1,
    const TreeIndex& t2, int it1subtree, int it2subtree,
    data_structures::Matrix<double>& forestdist, bool treesSwapped) {
  // Translate input subtree root nodes to left-to-right postorder.
  int i = t1.prel_to_postl_[it1subtree];
  int j = t2.prel_to_postl_[it2subtree];
  // We need to offset the node ids for accessing forestdist array which has
  // indices from 0 to subtree size. However, the subtree node indices do not
  // necessarily start with 0.
  // Whenever the original left-to-right postorder id has to be accessed, use
  // i+ioff and j+joff.
  int ioff = t1.postl_to_lld_[i] - 1;
  int joff = t2.postl_to_lld_[j] - 1;
  // Variables holding costs of each minimum element.
  float da = 0;
  float db = 0;
  float dc = 0;
  // Initialize forestdist array with deletion and insertion costs of each
  // relevant subforest.
  forestdist.at(0, 0) = 0;
  for (int i1 = 1; i1 <= i - ioff; ++i1) {
    forestdist.at(i1, 0) = forestdist.read_at(i1 - 1, 0) + (treesSwapped ? c_.ins(t1.postl_to_label_id_[i1 + ioff]) : c_.del(t1.postl_to_label_id_[i1 + ioff])); // TODO: USE COST MODEL - delete i1.
  }
  for (int j1 = 1; j1 <= j - joff; ++j1) {
    forestdist.at(0, j1) = forestdist.read_at(0, j1 - 1) + (treesSwapped ? c_.del(t2.postl_to_label_id_[j1 + joff]) : c_.ins(t2.postl_to_label_id_[j1 + joff])); // TODO: USE COST MODEL - insert j1.
  }
  // Fill in the remaining costs.
  for (int i1 = 1; i1 <= i - ioff; ++i1) {
    for (int j1 = 1; j1 <= j - joff; ++j1) {
      // Increment the number of subproblems.
      ++subproblem_counter_;
      // Calculate partial distance values for this subproblem.
      double u = (treesSwapped ? c_.ren(t2.postl_to_label_id_[j1 + joff], t1.postl_to_label_id_[i1 + ioff]) : c_.ren(t1.postl_to_label_id_[i1 + ioff], t2.postl_to_label_id_[j1 + joff])); // TODO: USE COST MODEL - rename i1 to j1.
      da = forestdist.read_at(i1 - 1, j1) + (treesSwapped ? c_.ins(t1.postl_to_label_id_[i1 + ioff]) : c_.del(t1.postl_to_label_id_[i1 + ioff])); // TODO: USE COST MODEL - delete i1.
      db = forestdist.read_at(i1, j1 - 1) + (treesSwapped ? c_.del(t2.postl_to_label_id_[j1 + joff]) : c_.ins(t2.postl_to_label_id_[j1 + joff])); // TODO: USE COST MODEL - insert j1.
      // If current subforests are subtrees.
      if (t1.postl_to_lld_[i1 + ioff] == t1.postl_to_lld_[i] && t2.postl_to_lld_[j1 + joff] == t2.postl_to_lld_[j]) {
        dc = forestdist.read_at(i1 - 1, j1 - 1) + u;
        // Store the relevant distance value in delta array.
        if (treesSwapped) {
          delta_.at(t2.postl_to_prel_[j1 + joff], t1.postl_to_prel_[i1 + ioff]) = forestdist.read_at(i1 - 1, j1 - 1);
        } else {
          delta_.at(t1.postl_to_prel_[i1 + ioff], t2.postl_to_prel_[j1 + joff]) = forestdist.read_at(i1 - 1, j1 - 1);
        }
      } else {
        dc = forestdist.read_at(t1.postl_to_lld_[i1 + ioff] - 1 - ioff, t2.postl_to_lld_[j1 + joff] - 1 - joff) +
          (treesSwapped ? delta_.read_at(t2.postl_to_prel_[j1 + joff], t1.postl_to_prel_[i1 + ioff]) : delta_.read_at(t1.postl_to_prel_[i1 + ioff], t2.postl_to_prel_[j1 + joff])) + u;
      }
      // Calculate final minimum.
      forestdist.at(i1, j1) = da >= db ? db >= dc ? dc : db : da >= dc ? dc : da;
    }
  }
}